

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# architecture.cc
# Opt level: O0

void __thiscall Architecture::parseReadOnly(Architecture *this,Element *el)

{
  bool bVar1;
  reference ppEVar2;
  undefined1 local_50 [8];
  Range range;
  __normal_iterator<Element_*const_*,_std::vector<Element_*,_std::allocator<Element_*>_>_> local_28;
  const_iterator iter;
  List *list;
  Element *el_local;
  Architecture *this_local;
  
  iter._M_current = (Element **)Element::getChildren(el);
  __gnu_cxx::
  __normal_iterator<Element_*const_*,_std::vector<Element_*,_std::allocator<Element_*>_>_>::
  __normal_iterator(&local_28);
  local_28._M_current =
       (Element **)std::vector<Element_*,_std::allocator<Element_*>_>::begin(iter._M_current);
  while( true ) {
    range.last = (uintb)std::vector<Element_*,_std::allocator<Element_*>_>::end
                                  ((vector<Element_*,_std::allocator<Element_*>_> *)iter._M_current)
    ;
    bVar1 = __gnu_cxx::operator!=
                      (&local_28,
                       (__normal_iterator<Element_*const_*,_std::vector<Element_*,_std::allocator<Element_*>_>_>
                        *)&range.last);
    if (!bVar1) break;
    Range::Range((Range *)local_50);
    ppEVar2 = __gnu_cxx::
              __normal_iterator<Element_*const_*,_std::vector<Element_*,_std::allocator<Element_*>_>_>
              ::operator*(&local_28);
    Range::restoreXml((Range *)local_50,*ppEVar2,&this->super_AddrSpaceManager);
    Database::setPropertyRange(this->symboltab,0x4000,(Range *)local_50);
    __gnu_cxx::
    __normal_iterator<Element_*const_*,_std::vector<Element_*,_std::allocator<Element_*>_>_>::
    operator++(&local_28);
  }
  return;
}

Assistant:

void Architecture::parseReadOnly(const Element *el)

{
  const List &list(el->getChildren());
  List::const_iterator iter;
  
  for(iter=list.begin();iter!=list.end();++iter) {
    Range range;
    range.restoreXml(*iter,this);
    symboltab->setPropertyRange(Varnode::readonly,range);
  }
}